

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.hpp
# Opt level: O2

void __thiscall duckdb::PragmaInfo::PragmaInfo(PragmaInfo *this)

{
  (this->super_ParseInfo).info_type = PRAGMA_INFO;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__PragmaInfo_0178af30;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->parameters).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parameters).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameters).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->named_parameters)._M_h._M_buckets = &(this->named_parameters)._M_h._M_single_bucket;
  (this->named_parameters)._M_h._M_bucket_count = 1;
  (this->named_parameters)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_parameters)._M_h._M_element_count = 0;
  (this->named_parameters)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_parameters)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_parameters)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit ParseInfo(ParseInfoType info_type) : info_type(info_type) {
	}